

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cVertexAttribBindingTests.cpp
# Opt level: O3

long __thiscall glcts::anon_unknown_0::BasicInputCase3::Run(BasicInputCase3 *this)

{
  CallLogWrapper *this_00;
  Vec4 *pVVar1;
  long lVar2;
  GLuint i;
  GLuint index;
  GLubyte d [4];
  undefined8 local_30;
  undefined4 local_28;
  
  this_00 = &(this->super_BasicInputBase).super_VertexAttribBindingBase.super_SubcaseBase.
             super_GLWrapper.super_CallLogWrapper;
  index = 0;
  do {
    glu::CallLogWrapper::glVertexAttrib4f(this_00,index,0.0,0.0,0.0,0.0);
    index = index + 1;
  } while (index != 0x10);
  glu::CallLogWrapper::glBindBuffer(this_00,0x8892,this->m_vbo);
  glu::CallLogWrapper::glBufferData(this_00,0x8892,0x48,(void *)0x0,0x88e4);
  local_30 = CONCAT44(local_30._4_4_,0x4030201);
  glu::CallLogWrapper::glBufferSubData(this_00,0x8892,0,4,&local_30);
  local_30 = 0x40c0000040a00000;
  local_28 = 0x40e00000;
  glu::CallLogWrapper::glBufferSubData(this_00,0x8892,0x10,0xc,&local_30);
  local_30 = 0x4110000041000000;
  glu::CallLogWrapper::glBufferSubData(this_00,0x8892,0x1c,8,&local_30);
  local_30 = CONCAT44(local_30._4_4_,0xd0c0b0a);
  glu::CallLogWrapper::glBufferSubData(this_00,0x8892,0x24,4,&local_30);
  local_30 = 0x4170000041600000;
  local_28 = 0x41800000;
  glu::CallLogWrapper::glBufferSubData(this_00,0x8892,0x34,0xc,&local_30);
  local_30 = 0x4190000041880000;
  glu::CallLogWrapper::glBufferSubData(this_00,0x8892,0x40,8,&local_30);
  glu::CallLogWrapper::glBindBuffer(this_00,0x8892,0);
  glu::CallLogWrapper::glBindVertexArray(this_00,this->m_vao);
  glu::CallLogWrapper::glEnableVertexAttribArray(this_00,1);
  glu::CallLogWrapper::glVertexAttribFormat(this_00,0,4,0x1401,'\0',0);
  glu::CallLogWrapper::glVertexAttribBinding(this_00,1,3);
  glu::CallLogWrapper::glVertexAttribFormat(this_00,1,3,0x1406,'\0',0x10);
  glu::CallLogWrapper::glVertexAttribBinding(this_00,2,3);
  glu::CallLogWrapper::glVertexAttribFormat(this_00,2,2,0x1406,'\0',0x1c);
  glu::CallLogWrapper::glVertexAttribBinding(this_00,0,3);
  glu::CallLogWrapper::glBindVertexBuffer(this_00,3,this->m_vbo,0,0x24);
  glu::CallLogWrapper::glEnableVertexAttribArray(this_00,0);
  glu::CallLogWrapper::glEnableVertexAttribArray(this_00,2);
  (this->super_BasicInputBase).expected_data[0].m_data[0] = 1.0;
  (this->super_BasicInputBase).expected_data[0].m_data[1] = 2.0;
  (this->super_BasicInputBase).expected_data[0].m_data[2] = 3.0;
  (this->super_BasicInputBase).expected_data[0].m_data[3] = 4.0;
  (this->super_BasicInputBase).expected_data[1].m_data[0] = 5.0;
  (this->super_BasicInputBase).expected_data[1].m_data[1] = 6.0;
  pVVar1 = (this->super_BasicInputBase).expected_data;
  pVVar1[1].m_data[2] = 7.0;
  pVVar1[1].m_data[3] = 1.0;
  (this->super_BasicInputBase).expected_data[2].m_data[0] = 8.0;
  (this->super_BasicInputBase).expected_data[2].m_data[1] = 9.0;
  pVVar1 = (this->super_BasicInputBase).expected_data;
  pVVar1[2].m_data[2] = 0.0;
  pVVar1[2].m_data[3] = 1.0;
  (this->super_BasicInputBase).expected_data[0xf].m_data[0] = 10.0;
  (this->super_BasicInputBase).expected_data[0xf].m_data[1] = 11.0;
  pVVar1 = (this->super_BasicInputBase).expected_data;
  pVVar1[0xf].m_data[2] = 12.0;
  pVVar1[0xf].m_data[3] = 13.0;
  (this->super_BasicInputBase).expected_data[0x10].m_data[0] = 14.0;
  (this->super_BasicInputBase).expected_data[0x10].m_data[1] = 15.0;
  pVVar1 = (this->super_BasicInputBase).expected_data;
  pVVar1[0x10].m_data[2] = 16.0;
  pVVar1[0x10].m_data[3] = 1.0;
  (this->super_BasicInputBase).expected_data[0x11].m_data[0] = 17.0;
  (this->super_BasicInputBase).expected_data[0x11].m_data[1] = 18.0;
  pVVar1 = (this->super_BasicInputBase).expected_data;
  pVVar1[0x11].m_data[2] = 0.0;
  pVVar1[0x11].m_data[3] = 1.0;
  lVar2 = BasicInputBase::Run(&this->super_BasicInputBase);
  return lVar2;
}

Assistant:

virtual long Run()
	{
		for (GLuint i = 0; i < 16; ++i)
		{
			glVertexAttrib4f(i, 0.0f, 0.0f, 0.0f, 0.0f);
		}
		glBindBuffer(GL_ARRAY_BUFFER, m_vbo);
		glBufferData(GL_ARRAY_BUFFER, 36 * 2, NULL, GL_STATIC_DRAW);
		/* */
		{
			GLubyte d[] = { 1, 2, 3, 4 };
			glBufferSubData(GL_ARRAY_BUFFER, 0, sizeof(d), d);
		}
		glBufferSubData(GL_ARRAY_BUFFER, 16, sizeof(Vec3), &Vec3(5.0f, 6.0f, 7.0f)[0]);
		glBufferSubData(GL_ARRAY_BUFFER, 28, sizeof(Vec2), &Vec2(8.0f, 9.0f)[0]);
		/* */
		{
			GLubyte d[] = { 10, 11, 12, 13 };
			glBufferSubData(GL_ARRAY_BUFFER, 0 + 36, sizeof(d), d);
		}
		glBufferSubData(GL_ARRAY_BUFFER, 16 + 36, sizeof(Vec3), &Vec3(14.0f, 15.0f, 16.0f)[0]);
		glBufferSubData(GL_ARRAY_BUFFER, 28 + 36, sizeof(Vec2), &Vec2(17.0f, 18.0f)[0]);
		glBindBuffer(GL_ARRAY_BUFFER, 0);

		glBindVertexArray(m_vao);
		glEnableVertexAttribArray(1);
		glVertexAttribFormat(0, 4, GL_UNSIGNED_BYTE, GL_FALSE, 0);
		glVertexAttribBinding(1, 3);
		glVertexAttribFormat(1, 3, GL_FLOAT, GL_FALSE, 16);
		glVertexAttribBinding(2, 3);
		glVertexAttribFormat(2, 2, GL_FLOAT, GL_FALSE, 28);
		glVertexAttribBinding(0, 3);
		glBindVertexBuffer(3, m_vbo, 0, 36);
		glEnableVertexAttribArray(0);
		glEnableVertexAttribArray(2);

		expected_data[0]	  = Vec4(1.0f, 2.0f, 3.0f, 4.0f);
		expected_data[1]	  = Vec4(5.0f, 6.0f, 7.0f, 1.0f);
		expected_data[2]	  = Vec4(8.0f, 9.0f, 0.0f, 1.0f);
		expected_data[0 + 15] = Vec4(10.0f, 11.0f, 12.0f, 13.0f);
		expected_data[1 + 15] = Vec4(14.0f, 15.0f, 16.0f, 1.0f);
		expected_data[2 + 15] = Vec4(17.0f, 18.0f, 0.0f, 1.0f);
		return BasicInputBase::Run();
	}